

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O2

long oggpack_read(oggpack_buffer *b,int bits)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  if ((uint)bits < 0x21) {
    iVar1 = b->endbit;
    uVar6 = bits + iVar1;
    lVar2 = b->endbyte;
    lVar5 = b->storage;
    if (lVar5 + -4 <= lVar2) {
      if (lVar5 - ((int)(uVar6 + 7) >> 3) < lVar2) goto LAB_001c43eb;
      if (uVar6 == 0) {
        return 0;
      }
    }
    pbVar3 = b->ptr;
    bVar4 = (byte)iVar1;
    uVar7 = (ulong)(*pbVar3 >> (bVar4 & 0x1f));
    if ((((8 < (int)uVar6) &&
         (uVar7 = (long)(int)((uint)pbVar3[1] << (8 - bVar4 & 0x1f)) | uVar7, 0x10 < uVar6)) &&
        (uVar7 = uVar7 | (long)(int)((uint)pbVar3[2] << (0x10 - bVar4 & 0x1f)), 0x18 < uVar6)) &&
       (uVar7 = uVar7 | (long)(int)((uint)pbVar3[3] << (0x18 - bVar4 & 0x1f)),
       iVar1 != 0 && 0x20 < uVar6)) {
      uVar7 = uVar7 | (long)(int)((uint)pbVar3[4] << (-bVar4 & 0x1f));
    }
    uVar7 = uVar7 & mask[(uint)bits];
    b->ptr = pbVar3 + (int)uVar6 / 8;
    b->endbyte = lVar2 + (int)uVar6 / 8;
    b->endbit = uVar6 & 7;
  }
  else {
    lVar5 = b->storage;
LAB_001c43eb:
    b->ptr = (uchar *)0x0;
    b->endbyte = lVar5;
    b->endbit = 1;
    uVar7 = 0xffffffffffffffff;
  }
  return uVar7;
}

Assistant:

long oggpack_read(oggpack_buffer *b,int bits){
  long ret;
  unsigned long m;

  if(bits<0 || bits>32) goto err;
  m=mask[bits];
  bits+=b->endbit;

  if(b->endbyte >= b->storage-4){
    /* not the main path */
    if(b->endbyte > b->storage-((bits+7)>>3)) goto overflow;
    /* special case to avoid reading b->ptr[0], which might be past the end of
        the buffer; also skips some useless accounting */
    else if(!bits)return(0L);
  }

  ret=b->ptr[0]>>b->endbit;
  if(bits>8){
    ret|=b->ptr[1]<<(8-b->endbit);
    if(bits>16){
      ret|=b->ptr[2]<<(16-b->endbit);
      if(bits>24){
        ret|=b->ptr[3]<<(24-b->endbit);
        if(bits>32 && b->endbit){
          ret|=b->ptr[4]<<(32-b->endbit);
        }
      }
    }
  }
  ret&=m;
  b->ptr+=bits/8;
  b->endbyte+=bits/8;
  b->endbit=bits&7;
  return ret;

 overflow:
 err:
  b->ptr=NULL;
  b->endbyte=b->storage;
  b->endbit=1;
  return -1L;
}